

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMNodeImpl::lookupPrefix(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar2;
  undefined4 extraout_var_01;
  DOMNode *local_58;
  DOMNode *ancestor;
  short type;
  DOMNode *thisNode;
  XMLCh *namespaceURI_local;
  DOMNodeImpl *this_local;
  
  if (namespaceURI == (XMLCh *)0x0) {
    this_local = (DOMNodeImpl *)0x0;
  }
  else {
    local_58 = getContainingNode(this);
    iVar1 = (*local_58->_vptr_DOMNode[4])();
    switch((short)iVar1) {
    case 1:
      this_local = (DOMNodeImpl *)lookupPrefix(this,namespaceURI,(DOMElement *)local_58);
      break;
    case 2:
      iVar1 = (*this->fOwnerNode->_vptr_DOMNode[4])();
      if (iVar1 == 1) {
        iVar1 = (*this->fOwnerNode->_vptr_DOMNode[0x23])(this->fOwnerNode,namespaceURI);
        this_local = (DOMNodeImpl *)CONCAT44(extraout_var_00,iVar1);
      }
      else {
        this_local = (DOMNodeImpl *)0x0;
      }
      break;
    default:
      pDVar2 = getElementAncestor(this,local_58);
      if (pDVar2 == (DOMNode *)0x0) {
        this_local = (DOMNodeImpl *)0x0;
      }
      else {
        iVar1 = (*pDVar2->_vptr_DOMNode[0x23])(pDVar2,namespaceURI);
        this_local = (DOMNodeImpl *)CONCAT44(extraout_var_01,iVar1);
      }
      break;
    case 6:
    case 10:
    case 0xb:
    case 0xc:
      this_local = (DOMNodeImpl *)0x0;
      break;
    case 9:
      if (local_58 == (DOMNode *)0x0) {
        local_58 = (DOMNode *)0x0;
      }
      else {
        local_58 = local_58 + -3;
      }
      iVar1 = (*local_58->_vptr_DOMNode[0xd])();
      this_local = (DOMNodeImpl *)
                   (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x118))
                             ((long *)CONCAT44(extraout_var,iVar1),namespaceURI);
    }
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* namespaceURI) const {
    // REVISIT: When Namespaces 1.1 comes out this may not be true
    // Prefix can't be bound to null namespace
    if (namespaceURI == 0) {
        return 0;
    }

    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();

    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        return lookupPrefix(namespaceURI, (DOMElement*)thisNode);
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->lookupPrefix(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupPrefix(namespaceURI);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupPrefix(namespaceURI);
        }
        return 0;
    }
    }
}